

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_model_sampling(V *values,int num_keys,LinearModel<int> *model,bool verbose)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ostream *poVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar15 [16];
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar28 [16];
  double dVar29;
  double local_e8;
  double local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [96];
  undefined8 uStack_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar14;
  
  if (num_keys < 0x15) {
    build_model(values,num_keys,model,false);
    return;
  }
  dVar21 = (double)num_keys;
  uVar13 = 1;
  do {
    uVar12 = uVar13;
    dVar21 = dVar21 * 0.5;
    uVar13 = uVar12 * 2;
  } while (10.0 <= dVar21);
  auVar15 = ZEXT816(0xffefffffffffffff);
  auVar26 = ZEXT816(0x7fefffffffffffff);
  uVar12 = uVar12 & 0x7fffffff;
  uVar14 = (ulong)uVar12;
  local_c8._84_4_ = -0x80000000;
  local_c8._80_4_ = 0x7fffffff;
  local_c8._64_10_ = (unkbyte10)0;
  uVar11 = 0;
  local_c8._8_4_ = 0;
  local_c8._48_10_ = local_c8._64_10_;
  local_c8._32_10_ = local_c8._64_10_;
  local_c8._16_10_ = local_c8._64_10_;
  do {
    iVar6 = values[uVar11].first;
    auVar27._0_8_ = (double)(int)uVar11;
    auVar27._8_8_ = in_XMM3_Qa;
    local_c8._8_4_ = local_c8._8_4_ + 1;
    auVar26 = vminsd_avx(auVar26,auVar27);
    auVar15 = vmaxsd_avx(auVar15,auVar27);
    lVar16 = (longdouble)iVar6;
    local_c8._16_10_ = (longdouble)local_c8._16_10_ + lVar16;
    if (iVar6 <= (int)local_c8._80_4_) {
      local_c8._80_4_ = iVar6;
    }
    lVar17 = (longdouble)(int)uVar11;
    if (iVar6 < (int)local_c8._84_4_) {
      iVar6 = local_c8._84_4_;
    }
    local_c8._84_4_ = iVar6;
    uVar11 = uVar11 + uVar14;
    local_c8._32_10_ = (longdouble)local_c8._32_10_ + lVar17;
    local_c8._48_10_ = lVar16 * lVar16 + (longdouble)local_c8._48_10_;
    local_c8._64_10_ = lVar17 * lVar16 + (longdouble)local_c8._64_10_;
  } while (uVar11 < (uint)num_keys);
  uStack_68 = auVar15._0_8_;
  local_c8._88_8_ = auVar26._0_8_;
  local_c8._0_8_ = model;
  LinearModelBuilder<int>::build((LinearModelBuilder<int> *)local_c8);
  local_e8 = model->a_;
  dVar21 = model->b_;
  uStack_d0 = local_d8;
  local_d8 = dVar21;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Build index, sample size: ",0x1a);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)num_keys / uVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (a, b): (",10);
    poVar7 = std::ostream::_M_insert<double>(local_e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
    poVar7 = std::ostream::_M_insert<double>(dVar21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if (3 < uVar13) {
    local_48 = 0x7fffffffffffffff;
    uStack_40 = 0x7fffffffffffffff;
    do {
      auVar25 = ZEXT1664(stack0xffffffffffffff90);
      uVar13 = (uint)uVar14;
      uVar12 = uVar13 >> 1;
      uVar14 = (ulong)uVar12;
      iVar10 = 0;
      lVar16 = (longdouble)local_c8._16_10_;
      lVar17 = (longdouble)local_c8._32_10_;
      lVar20 = (longdouble)local_c8._48_10_;
      lVar19 = (longdouble)local_c8._64_10_;
      iVar6 = local_c8._84_4_;
      iVar8 = local_c8._80_4_;
      iVar9 = local_c8._8_4_;
      do {
        iVar10 = iVar10 + uVar12;
        if (iVar10 < num_keys) {
          auVar26._0_8_ = (double)iVar10;
          iVar9 = iVar9 + 1;
          iVar1 = values[iVar10].first;
          auVar26._8_8_ = auVar26._0_8_;
          auVar15 = vunpcklpd_avx(auVar25._0_16_,auVar26);
          auVar28._8_8_ = auVar25._8_8_;
          auVar28._0_8_ = auVar26._0_8_;
          lVar18 = (longdouble)iVar1;
          if (iVar1 <= iVar8) {
            iVar8 = iVar1;
          }
          uVar11 = vcmppd_avx512vl(auVar15,auVar28,1);
          lVar16 = lVar16 + lVar18;
          if (iVar6 <= iVar1) {
            iVar6 = iVar1;
          }
          lVar17 = lVar17 + (longdouble)iVar10;
          lVar20 = lVar18 * lVar18 + lVar20;
          lVar19 = (longdouble)iVar10 * lVar18 + lVar19;
          iVar10 = iVar10 + uVar12;
          bVar2 = (bool)((byte)(uVar11 & 3) & 1);
          local_c8._88_8_ = (ulong)bVar2 * auVar25._0_8_ | (ulong)!bVar2 * (long)auVar26._0_8_;
          uVar11 = (uVar11 & 3) >> 1;
          uStack_68 = uVar11 * auVar25._8_8_ | (ulong)!SUB81(uVar11,0) * (long)auVar26._0_8_;
          auVar25 = ZEXT1664(register0x000008fc);
          local_c8._8_4_ = iVar9;
          local_c8._16_10_ = lVar16;
          local_c8._32_10_ = lVar17;
          local_c8._48_10_ = lVar20;
          local_c8._64_10_ = lVar19;
          local_c8._80_4_ = iVar8;
          local_c8._84_4_ = iVar6;
        }
      } while (iVar10 < num_keys);
      LinearModelBuilder<int>::build((LinearModelBuilder<int> *)local_c8);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = model->a_;
      if ((local_e8 != 0.0) || (NAN(local_e8))) {
        auVar22._0_8_ = (model->a_ - local_e8) / local_e8;
        auVar22._8_8_ = 0;
        auVar4._8_8_ = 0x7fffffffffffffff;
        auVar4._0_8_ = 0x7fffffffffffffff;
        auVar15 = vandpd_avx512vl(auVar22,auVar4);
        dVar21 = auVar15._0_8_;
      }
      else {
        uVar3 = vcmpsd_avx512f(auVar15,ZEXT816(0) << 0x40,4);
        dVar21 = (double)((ulong)((byte)uVar3 & 1) * 0x3ff0000000000000);
      }
      auVar5._8_8_ = uStack_40;
      auVar5._0_8_ = local_48;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = model->b_ - local_d8;
      auVar15 = vandpd_avx(auVar23,auVar5);
      auVar24._0_8_ = auVar15._0_8_ / local_d8;
      auVar24._8_8_ = auVar15._8_8_;
      auVar26 = vandpd_avx(auVar24,auVar5);
      local_d8 = auVar26._0_8_;
      dVar29 = auVar15._0_8_;
      if (verbose) {
        local_58 = auVar15;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Build index, sample size: ",0x1a);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)num_keys / uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," (a, b): (",10);
        poVar7 = std::ostream::_M_insert<double>(model->a_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = std::ostream::_M_insert<double>(model->b_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") (",3);
        poVar7 = std::ostream::_M_insert<double>(dVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = std::ostream::_M_insert<double>(local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        dVar29 = (double)local_58._0_8_;
      }
      if (dVar21 < 0.01) {
        if (dVar29 < 0.5) {
          return;
        }
        if (local_d8 < 0.01) {
          return;
        }
      }
      local_e8 = model->a_;
      uStack_d0 = auVar26._8_8_;
      local_d8 = model->b_;
    } while (3 < uVar13);
  }
  return;
}

Assistant:

static void build_model_sampling(const V* values, int num_keys,
                                   LinearModel<T>* model,
                                   bool verbose = false) {
    const static int sample_size_lower_bound = 10;
    // If slope and intercept change by less than this much between samples,
    // return
    const static double rel_change_threshold = 0.01;
    // If intercept changes by less than this much between samples, return
    const static double abs_change_threshold = 0.5;
    // Increase sample size by this many times each iteration
    const static int sample_size_multiplier = 2;

    // If the number of keys is sufficiently small, we do not sample
    if (num_keys <= sample_size_lower_bound * sample_size_multiplier) {
      build_model(values, num_keys, model, false);
      return;
    }

    int step_size = 1;
    double sample_size = num_keys;
    while (sample_size >= sample_size_lower_bound) {
      sample_size /= sample_size_multiplier;
      step_size *= sample_size_multiplier;
    }
    step_size /= sample_size_multiplier;

    // Run with initial step size
    LinearModelBuilder<T> builder(model);
    for (int i = 0; i < num_keys; i += step_size) {
      builder.add(values[i].first, i);
    }
    builder.build();
    double prev_a = model->a_;
    double prev_b = model->b_;
    if (verbose) {
      std::cout << "Build index, sample size: " << num_keys / step_size
                << " (a, b): (" << prev_a << ", " << prev_b << ")" << std::endl;
    }

    // Keep decreasing step size (increasing sample size) until model does not
    // change significantly
    while (step_size > 1) {
      step_size /= sample_size_multiplier;
      // Need to avoid processing keys we already processed in previous samples
      int i = 0;
      while (i < num_keys) {
        i += step_size;
        for (int j = 1; (j < sample_size_multiplier) && (i < num_keys);
             j++, i += step_size) {
          builder.add(values[i].first, i);
        }
      }
      builder.build();

      double rel_change_in_a = prev_a == 0 ? (model->a_ != 0) 
                               : std::abs((model->a_ - prev_a) / prev_a);
      double abs_change_in_b = std::abs(model->b_ - prev_b);
      double rel_change_in_b = std::abs(abs_change_in_b / prev_b);
      if (verbose) {
        std::cout << "Build index, sample size: " << num_keys / step_size
                  << " (a, b): (" << model->a_ << ", " << model->b_ << ") ("
                  << rel_change_in_a << ", " << rel_change_in_b << ")"
                  << std::endl;
      }
      if (rel_change_in_a < rel_change_threshold &&
          (rel_change_in_b < rel_change_threshold ||
           abs_change_in_b < abs_change_threshold)) {
        return;
      }
      prev_a = model->a_;
      prev_b = model->b_;
    }
  }